

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertTrue
          (UtestShell *this,bool condition,char *checkString,char *conditionString,char *text,
          char *fileName,int lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_88;
  SimpleString local_80;
  SimpleString local_78;
  TestFailure local_70;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x27])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (!condition) {
    SimpleString::SimpleString(&local_80,checkString);
    SimpleString::SimpleString(&local_88,conditionString);
    SimpleString::SimpleString(&local_78,text);
    CheckFailure::CheckFailure
              ((CheckFailure *)&local_70,this,fileName,lineNumber,&local_80,&local_88,&local_78);
    (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
    TestFailure::~TestFailure(&local_70);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&local_88);
    SimpleString::~SimpleString(&local_80);
  }
  return;
}

Assistant:

void UtestShell::assertTrue(bool condition, const char *checkString, const char *conditionString, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!condition)
        failWith(CheckFailure(this, fileName, lineNumber, checkString, conditionString, text), testTerminator);
}